

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O0

void __thiscall GeometricObject::~GeometricObject(GeometricObject *this)

{
  code *pcVar1;
  GeometricObject *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

GeometricObject::~GeometricObject()
{
    Texture *m;

    if(mapping) delete mapping;

    for( m = material; m != 0; m = material )
    {
        material = material->next;
        delete m;
    }

//  if(transform) delete transform;
}